

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout.c
# Opt level: O2

void stdout_anything(t_stdout *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  FILE *__s;
  t_symbol *ptVar2;
  size_t sVar3;
  size_t sVar4;
  uint argc_00;
  ulong uVar5;
  word *pwVar6;
  ulong uVar7;
  bool bVar8;
  t_float tVar9;
  t_float atStack_10038 [249];
  undefined1 local_fc51;
  
  if (x->x_mode == 3) {
    pd_tilde_putsymbol(s,(FILE *)_stdout);
    pwVar6 = &argv->a_w;
    while (__s = _stdout, bVar8 = argc != 0, argc = argc + -1, bVar8) {
      if (((t_atom *)(pwVar6 + -1))->a_type == A_SYMBOL) {
        pd_tilde_putsymbol(pwVar6->w_symbol,(FILE *)_stdout);
      }
      else if (((t_atom *)(pwVar6 + -1))->a_type == A_FLOAT) {
        atStack_10038[0] = pwVar6->w_float;
        putc(1,_stdout);
        fwrite(atStack_10038,4,1,__s);
      }
      pwVar6 = pwVar6 + 2;
    }
    putc(4,_stdout);
    if (x->x_flush == 0) {
      return;
    }
    fflush(_stdout);
    return;
  }
  if (x->x_mode == 2) {
    ptVar2 = gensym("list");
    if (((ptVar2 != s) && (ptVar2 = gensym("float"), ptVar2 != s)) &&
       (ptVar2 = gensym("bang"), ptVar2 != s)) {
      pd_error(x,"stdout: only \'list\' messages allowed in binary mode (got \'%s\')",s->s_name);
      return;
    }
    argc_00 = 0xffff;
    if (argc < 0xffff) {
      argc_00 = argc;
    }
    uVar7 = 0;
    uVar5 = 0;
    if (0 < (int)argc_00) {
      uVar5 = (ulong)argc_00;
    }
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      tVar9 = atom_getfloatarg((int)uVar7,argc_00,argv);
      *(char *)((long)atStack_10038 + uVar7) = (char)(int)tVar9;
    }
    uVar7 = 0xfffe;
    if ((uint)uVar5 < 0xfffe) {
      uVar7 = uVar5;
    }
    *(undefined1 *)((long)atStack_10038 + uVar7) = 0;
    fwrite(atStack_10038,1,(long)(int)argc_00,_stdout);
    if (argc == 0) goto LAB_001a3fea;
    iVar1 = x->x_flush;
  }
  else {
    strncpy((char *)atStack_10038,s->s_name,1000);
    local_fc51 = 0;
    sVar3 = strlen((char *)atStack_10038);
    while (bVar8 = argc != 0, argc = argc + -1, bVar8) {
      if ((long)sVar3 < 999) {
        *(undefined2 *)((long)atStack_10038 + sVar3) = 0x20;
        sVar3 = sVar3 + 1;
      }
      atom_string(argv,(char *)((long)atStack_10038 + sVar3),1000 - (int)sVar3);
      sVar4 = strlen((char *)((long)atStack_10038 + sVar3));
      sVar3 = sVar3 + sVar4;
      argv = argv + 1;
    }
    if (x->x_mode == 1) {
      puts((char *)atStack_10038);
    }
    else {
      printf("%s;\n",atStack_10038);
    }
    iVar1 = x->x_flush;
  }
  if (iVar1 == 0) {
    return;
  }
LAB_001a3fea:
  fflush(_stdout);
  return;
}

Assistant:

static void stdout_anything(t_stdout *x, t_symbol *s, int argc, t_atom *argv)
{
    char msgbuf[MAXPDSTRING], *sp, *ep = msgbuf+MAXPDSTRING;
    if (x->x_mode == MODE_BIN)
    {
        if ((gensym("list") == s) || (gensym("float") == s) ||
            (gensym("bang") == s))
                stdout_binary(x, argc, argv);
        else
            pd_error(x,
 "stdout: only 'list' messages allowed in binary mode (got '%s')",
                s->s_name);
        return;
    }
    else if (x->x_mode == MODE_PDTILDE)
    {
        pd_tilde_putsymbol(s, stdout);
        for (; argc--; argv++)
        {
            if (argv->a_type == A_FLOAT)
                pd_tilde_putfloat(argv->a_w.w_float, stdout);
            else if (argv->a_type == A_SYMBOL)
                pd_tilde_putsymbol(argv->a_w.w_symbol, stdout);
        }
        putc(A_SEMI, stdout);
        if (x->x_flush)
            fflush(stdout);
        return;
    }
    msgbuf[0] = 0;
    strncpy(msgbuf, s->s_name, MAXPDSTRING);
    msgbuf[MAXPDSTRING-1] = 0;
    sp = msgbuf + strlen(msgbuf);
    while (argc--)
    {
        if (sp < ep-1)
            sp[0] = ' ', sp[1] = 0, sp++;
        atom_string(argv++, sp, (unsigned int)(ep-sp));
        sp += strlen(sp);
    }
    switch(x->x_mode) {
    case MODE_CR:
        printf("%s\n", msgbuf);
        break;
    default:
        printf("%s;\n", msgbuf);
    }
    if (x->x_flush)
        fflush(stdout);
}